

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseProperty.hh
# Opt level: O1

void __thiscall OpenMesh::BaseProperty::~BaseProperty(BaseProperty *this)

{
  pointer pcVar1;
  
  this->_vptr_BaseProperty = (_func_int **)&PTR__BaseProperty_001c3cc0;
  pcVar1 = (this->name_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->name_).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

virtual ~BaseProperty() {}